

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_file.hpp
# Opt level: O3

void __thiscall iutest::TempFile::Close(TempFile *this)

{
  FILE *__stream;
  
  __stream = (FILE *)(this->m_file).m_fp;
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
    (this->m_file).m_fp = (FILE *)0x0;
  }
  if (this->m_fd != -1) {
    close(this->m_fd);
    this->m_fd = -1;
  }
  return;
}

Assistant:

virtual void Close() IUTEST_CXX_OVERRIDE
    {
        m_file.Close();
        if( m_fd != -1 )
        {
            internal::posix::FdClose(m_fd);
            m_fd = -1;
        }
    }